

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createImportVarDeclarationNode
          (Parser *this,vector<Node_*,_std::allocator<Node_*>_> *var_keys)

{
  Node *pNVar1;
  size_type sVar2;
  CompilationContext *token;
  vector<Node_*,_std::allocator<Node_*>_> *in_RSI;
  undefined8 *in_RDI;
  Node *declarator;
  size_t i;
  Node *n;
  Token *in_stack_ffffffffffffff90;
  CompilationContext *in_stack_ffffffffffffff98;
  CompilationContext *ctx_;
  Node *in_stack_ffffffffffffffa0;
  Node *this_00;
  ulong local_30;
  
  pNVar1 = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pNVar1->nodeType = PNT_IMPORT_VAR_DECLARATION;
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(in_RSI);
    if (sVar2 <= local_30) break;
    token = (CompilationContext *)operator_new(0x30);
    this_00 = (Node *)*in_RDI;
    ctx_ = token;
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RSI,local_30);
    Node::Node(this_00,ctx_,(Token *)token);
    *(undefined4 *)
     &(token->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0x1e;
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RSI,local_30);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,(value_type *)ctx_);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,(value_type *)ctx_);
    local_30 = local_30 + 1;
  }
  return pNVar1;
}

Assistant:

Node * createImportVarDeclarationNode(vector<Node *> var_keys)
  {
    Node * n = new Node(ctx, emptyToken);
    n->nodeType = PNT_IMPORT_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      n->children.push_back(declarator);
    }

    return n;
  }